

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.hh
# Opt level: O1

int4 __thiscall TypeArray::compareDependency(TypeArray *this,Datatype *op)

{
  type_metatype tVar1;
  uint uVar2;
  
  uVar2 = op->size - (this->super_Datatype).size;
  if (uVar2 == 0) {
    tVar1 = (this->super_Datatype).metatype;
    if (tVar1 != op->metatype) {
      return (uint)((int)op->metatype <= (int)tVar1) * 2 + -1;
    }
    uVar2 = 0;
    if (this->arrayof != (Datatype *)op[1]._vptr_Datatype) {
      uVar2 = -(uint)(this->arrayof < (Datatype *)op[1]._vptr_Datatype) | 1;
    }
  }
  return uVar2;
}

Assistant:

const string &getName(void) const { return name; }